

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int32_t zng_inflateResetKeep(zng_stream *strm)

{
  internal_state *piVar1;
  int iVar2;
  ct_data_s *pcVar3;
  zng_stream *in_RDI;
  inflate_state *state;
  int32_t local_4;
  
  iVar2 = inflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    piVar1 = in_RDI->state;
    piVar1->gzhead = (zng_gz_headerp)0x0;
    in_RDI->total_out = 0;
    in_RDI->total_in = 0;
    in_RDI->msg = (char *)0x0;
    if (*(int *)&piVar1->pending_out != 0) {
      in_RDI->adler = *(uint *)&piVar1->pending_out & 1;
    }
    *(undefined4 *)&piVar1->pending_buf = 0x3f34;
    piVar1->wrap = 1;
    piVar1->gzindex = 0;
    *(undefined4 *)((long)&piVar1->pending_buf + 4) = 0;
    *(undefined4 *)((long)&piVar1->pending_out + 4) = 0;
    piVar1->pending_buf_size = 0xffffffff;
    piVar1->status = 0;
    piVar1->last_flush = 0;
    piVar1->prev = (Pos *)0x0;
    *(undefined4 *)&piVar1->head = 0;
    pcVar3 = piVar1->dyn_ltree + 300;
    piVar1->insert_string = (insert_string_cb)pcVar3;
    *(ct_data_s **)&piVar1->match_length = pcVar3;
    *(ct_data_s **)&piVar1->ins_h = pcVar3;
    piVar1->reproducible = -1;
    local_4 = 0;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateResetKeep)(PREFIX3(stream) *strm) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = NULL;
    if (state->wrap)        /* to support ill-conceived Java test suite */
        strm->adler = state->wrap & 1;
    state->mode = HEAD;
    state->check = ADLER32_INITIAL_VALUE;
    state->last = 0;
    state->havedict = 0;
    state->flags = -1;
    state->head = NULL;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    state->back = -1;
#ifdef INFLATE_STRICT
    state->dmax = 32768U;
#endif
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
    state->sane = 1;
#endif
    INFLATE_RESET_KEEP_HOOK(strm);  /* hook for IBM Z DFLTCC */
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}